

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::is2DTrilinearFilterResultValid
               (LookupPrecision *prec,ColorQuad *quad0,ColorQuad *quad1,Vec2 *xBounds0,
               Vec2 *yBounds0,Vec2 *xBounds1,Vec2 *yBounds1,Vec2 *zBounds,float searchStep,
               Vec4 *result)

{
  bool bVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float s;
  float fVar5;
  float fVar6;
  Vec4 c1;
  Vec4 c0;
  tcu local_f0 [16];
  tcu local_e0 [16];
  tcu local_d0 [16];
  tcu local_c0 [16];
  tcu local_b0 [16];
  tcu local_a0 [16];
  tcu local_90 [16];
  tcu local_80 [16];
  Vec4 local_70;
  tcu local_60 [16];
  tcu local_50 [16];
  tcu local_40 [16];
  
  bVar1 = isInColorBounds(prec,quad0,quad1,result);
  if (bVar1) {
    for (fVar5 = xBounds0->m_data[0]; fVar5 < xBounds0->m_data[1] + searchStep;
        fVar5 = fVar5 + searchStep) {
      for (fVar6 = yBounds0->m_data[0]; fVar4 = yBounds0->m_data[1], fVar6 < fVar4 + searchStep;
          fVar6 = fVar6 + searchStep) {
        uVar2 = -(uint)(fVar5 <= xBounds0->m_data[1]);
        fVar3 = (float)(~uVar2 & (uint)xBounds0->m_data[1] | uVar2 & (uint)fVar5);
        fVar4 = (float)(~-(uint)(fVar6 <= fVar4) & (uint)fVar4 |
                       -(uint)(fVar6 <= fVar4) & (uint)fVar6);
        operator*(local_b0,1.0 - fVar3,&quad0->p00);
        operator*(local_a0,1.0 - fVar4,(Vector<float,_4> *)local_b0);
        operator*(local_d0,fVar3,&quad0->p10);
        operator*(local_c0,1.0 - fVar4,(Vector<float,_4> *)local_d0);
        operator+(local_90,(Vector<float,_4> *)local_a0,(Vector<float,_4> *)local_c0);
        operator*(local_f0,1.0 - fVar3,&quad0->p01);
        operator*(local_e0,fVar4,(Vector<float,_4> *)local_f0);
        operator+(local_80,(Vector<float,_4> *)local_90,(Vector<float,_4> *)local_e0);
        operator*(local_50,fVar3,&quad0->p11);
        operator*(local_40,fVar4,(Vector<float,_4> *)local_50);
        operator+((tcu *)&local_70,(Vector<float,_4> *)local_80,(Vector<float,_4> *)local_40);
        for (fVar4 = xBounds1->m_data[0]; fVar4 <= xBounds1->m_data[1]; fVar4 = fVar4 + searchStep)
        {
          for (fVar3 = yBounds1->m_data[0]; fVar3 <= yBounds1->m_data[1]; fVar3 = fVar3 + searchStep
              ) {
            uVar2 = -(uint)(fVar4 <= xBounds1->m_data[1]);
            s = (float)(~uVar2 & (uint)xBounds1->m_data[1] | uVar2 & (uint)fVar4);
            operator*(local_c0,1.0 - s,&quad1->p00);
            operator*(local_b0,1.0 - fVar3,(Vector<float,_4> *)local_c0);
            operator*(local_e0,s,&quad1->p10);
            operator*(local_d0,1.0 - fVar3,(Vector<float,_4> *)local_e0);
            operator+(local_a0,(Vector<float,_4> *)local_b0,(Vector<float,_4> *)local_d0);
            operator*(local_40,1.0 - s,&quad1->p01);
            operator*(local_f0,fVar3,(Vector<float,_4> *)local_40);
            operator+(local_90,(Vector<float,_4> *)local_a0,(Vector<float,_4> *)local_f0);
            operator*(local_60,s,&quad1->p11);
            operator*(local_50,fVar3,(Vector<float,_4> *)local_60);
            operator+(local_80,(Vector<float,_4> *)local_90,(Vector<float,_4> *)local_50);
            bVar1 = isLinearRangeValid(prec,&local_70,(Vec4 *)local_80,zBounds,result);
            if (bVar1) {
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool is2DTrilinearFilterResultValid (const LookupPrecision&	prec,
											const ColorQuad&		quad0,
											const ColorQuad&		quad1,
											const Vec2&				xBounds0,
											const Vec2&				yBounds0,
											const Vec2&				xBounds1,
											const Vec2&				yBounds1,
											const Vec2&				zBounds,
											const float				searchStep,
											const Vec4&				result)
{
	DE_ASSERT(xBounds0.x() <= xBounds0.y());
	DE_ASSERT(yBounds0.x() <= yBounds0.y());
	DE_ASSERT(xBounds1.x() <= xBounds1.y());
	DE_ASSERT(yBounds1.x() <= yBounds1.y());
	DE_ASSERT(xBounds0.x() + searchStep > xBounds0.x()); // step is not effectively 0
	DE_ASSERT(xBounds0.y() + searchStep > xBounds0.y());
	DE_ASSERT(yBounds0.x() + searchStep > yBounds0.x());
	DE_ASSERT(yBounds0.y() + searchStep > yBounds0.y());
	DE_ASSERT(xBounds1.x() + searchStep > xBounds1.x());
	DE_ASSERT(xBounds1.y() + searchStep > xBounds1.y());
	DE_ASSERT(yBounds1.x() + searchStep > yBounds1.x());
	DE_ASSERT(yBounds1.y() + searchStep > yBounds1.y());

	if (!isInColorBounds(prec, quad0, quad1, result))
		return false;

	for (float x0 = xBounds0.x(); x0 < xBounds0.y()+searchStep; x0 += searchStep)
	{
		for (float y0 = yBounds0.x(); y0 < yBounds0.y()+searchStep; y0 += searchStep)
		{
			const float		a0	= de::min(x0, xBounds0.y());
			const float		b0	= de::min(y0, yBounds0.y());
			const Vec4		c0	= quad0.p00*(1.0f-a0)*(1.0f-b0) + quad0.p10*a0*(1.0f-b0) + quad0.p01*(1.0f-a0)*b0 + quad0.p11*a0*b0;

			for (float x1 = xBounds1.x(); x1 <= xBounds1.y(); x1 += searchStep)
			{
				for (float y1 = yBounds1.x(); y1 <= yBounds1.y(); y1 += searchStep)
				{
					const float		a1	= de::min(x1, xBounds1.y());
					const float		b1	= de::min(y1, yBounds1.y());
					const Vec4		c1	= quad1.p00*(1.0f-a1)*(1.0f-b1) + quad1.p10*a1*(1.0f-b1) + quad1.p01*(1.0f-a1)*b1 + quad1.p11*a1*b1;

					if (isLinearRangeValid(prec, c0, c1, zBounds, result))
						return true;
				}
			}
		}
	}

	return false;
}